

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X86DisassemblerDecoder.c
# Opt level: O0

_Bool isPrefixAtLocation(InternalInstruction *insn,uint8_t prefix,uint64_t location)

{
  uint64_t location_local;
  uint8_t prefix_local;
  InternalInstruction *insn_local;
  
  if (prefix == '&') {
    if (((insn->isPrefix26 & 1U) != 0) && (insn->prefix26 == location)) {
      return true;
    }
  }
  else if (prefix == '.') {
    if (((insn->isPrefix2e & 1U) != 0) && (insn->prefix2e == location)) {
      return true;
    }
  }
  else if (prefix == '6') {
    if (((insn->isPrefix36 & 1U) != 0) && (insn->prefix36 == location)) {
      return true;
    }
  }
  else if (prefix == '>') {
    if (((insn->isPrefix3e & 1U) != 0) && (insn->prefix3e == location)) {
      return true;
    }
  }
  else if (prefix == 'd') {
    if (((insn->isPrefix64 & 1U) != 0) && (insn->prefix64 == location)) {
      return true;
    }
  }
  else if (prefix == 'e') {
    if (((insn->isPrefix65 & 1U) != 0) && (insn->prefix65 == location)) {
      return true;
    }
  }
  else if (prefix == 'f') {
    if (((insn->isPrefix66 & 1U) != 0) && (insn->prefix66 == location)) {
      return true;
    }
  }
  else if (prefix == 'g') {
    if (((insn->isPrefix67 & 1U) != 0) && (insn->prefix67 == location)) {
      return true;
    }
  }
  else if (prefix == 0xf0) {
    if (((insn->isPrefixf0 & 1U) != 0) && (insn->prefixf0 == location)) {
      return true;
    }
  }
  else if (prefix == 0xf2) {
    if (((insn->isPrefixf2 & 1U) != 0) && (insn->prefixf2 == location)) {
      return true;
    }
  }
  else if (((prefix == 0xf3) && ((insn->isPrefixf3 & 1U) != 0)) && (insn->prefixf3 == location)) {
    return true;
  }
  return false;
}

Assistant:

static bool isPrefixAtLocation(struct InternalInstruction *insn, uint8_t prefix,
		uint64_t location)
{
	switch (prefix)
	{
	case 0x26:
		if (insn->isPrefix26 && insn->prefix26 == location)
			return true;
		break;
	case 0x2e:
		if (insn->isPrefix2e && insn->prefix2e == location)
			return true;
		break;
	case 0x36:
		if (insn->isPrefix36 && insn->prefix36 == location)
			return true;
		break;
	case 0x3e:
		if (insn->isPrefix3e && insn->prefix3e == location)
			return true;
		break;
	case 0x64:
		if (insn->isPrefix64 && insn->prefix64 == location)
			return true;
		break;
	case 0x65:
		if (insn->isPrefix65 && insn->prefix65 == location)
			return true;
		break;
	case 0x66:
		if (insn->isPrefix66 && insn->prefix66 == location)
			return true;
		break;
	case 0x67:
		if (insn->isPrefix67 && insn->prefix67 == location)
			return true;
		break;
	case 0xf0:
		if (insn->isPrefixf0 && insn->prefixf0 == location)
			return true;
		break;
	case 0xf2:
		if (insn->isPrefixf2 && insn->prefixf2 == location)
			return true;
		break;
	case 0xf3:
		if (insn->isPrefixf3 && insn->prefixf3 == location)
			return true;
		break;
	default:
		break;
	}
	return false;
}